

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::repairencfacs(tetgenmesh *this,int chkencflag)

{
  uint uVar1;
  long lVar2;
  void **ppvVar3;
  shellface *pppdVar4;
  int iVar5;
  face *chkfac;
  long *plVar6;
  point encpt1;
  memorypool *pmVar7;
  int qflag;
  point encpt;
  double ccent [3];
  int local_54;
  point local_50;
  double local_48 [3];
  
  local_50 = (point)0x0;
  local_54 = 0;
  pmVar7 = this->badsubfacs;
  lVar2 = pmVar7->items;
  if (0 < lVar2) {
    if (this->steinerleft != 0) {
      do {
        ppvVar3 = pmVar7->firstblock;
        pmVar7->pathblock = ppvVar3;
        pmVar7->pathitem =
             (void *)((long)ppvVar3 +
                     (((long)pmVar7->alignbytes + 8U) -
                     (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar7->alignbytes));
        pmVar7->pathitemsleft = pmVar7->itemsperblock;
        chkfac = (face *)memorypool::traverse(pmVar7);
        if (chkfac != (face *)0x0) {
          lVar2 = this->steinerleft;
          while (lVar2 != 0) {
            if (-1 < chkfac->shver) {
              pppdVar4 = chkfac->sh;
              if ((pppdVar4 != (shellface *)0x0) && (pppdVar4[3] != (shellface)0x0)) {
                uVar1 = *(uint *)((long)pppdVar4 + (long)this->shmarkindex * 4 + 4);
                if ((uVar1 & 4) != 0) {
                  *(uint *)((long)pppdVar4 + (long)this->shmarkindex * 4 + 4) = uVar1 & 0xfffffffb;
                  encpt1 = (point)&local_54;
                  iVar5 = checkfac4split(this,chkfac,&local_50,&local_54,local_48);
                  if (iVar5 != 0) {
                    splitsubface(this,chkfac,local_50,encpt1,local_54,local_48,chkencflag);
                  }
                }
              }
              chkfac->shver = -1;
              pmVar7 = this->badsubfacs;
              chkfac->sh = (shellface *)pmVar7->deaditemstack;
              pmVar7->deaditemstack = chkfac;
              pmVar7->items = pmVar7->items + -1;
            }
            chkfac = (face *)memorypool::traverse(this->badsubfacs);
            if (chkfac == (face *)0x0) break;
            lVar2 = this->steinerleft;
          }
        }
        pmVar7 = this->badsubfacs;
        lVar2 = pmVar7->items;
        if (lVar2 < 1) {
          return;
        }
      } while (this->steinerleft != 0);
    }
    if (0 < lVar2) {
      if (this->steinerleft != 0) {
        puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
        puts("  the message above, your input data set, and the exact");
        puts("  command line you used to run this program, thank you.");
        exit(2);
      }
      if (this->b->verbose != 0) {
        puts("The desired number of Steiner points is reached.");
      }
      pmVar7 = this->badsubfacs;
      ppvVar3 = pmVar7->firstblock;
      pmVar7->pathblock = ppvVar3;
      pmVar7->pathitem =
           (void *)((long)ppvVar3 +
                   (((long)pmVar7->alignbytes + 8U) -
                   (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar7->alignbytes));
      pmVar7->pathitemsleft = pmVar7->itemsperblock;
      while (plVar6 = (long *)memorypool::traverse(pmVar7), plVar6 != (long *)0x0) {
        if (((-1 < (int)plVar6[1]) && (lVar2 = *plVar6, lVar2 != 0)) &&
           (*(long *)(lVar2 + 0x18) != 0)) {
          uVar1 = *(uint *)(lVar2 + 4 + (long)this->shmarkindex * 4);
          if ((uVar1 & 4) != 0) {
            *(uint *)(lVar2 + 4 + (long)this->shmarkindex * 4) = uVar1 & 0xfffffffb;
          }
        }
        pmVar7 = this->badsubfacs;
      }
      pmVar7 = this->badsubfacs;
      pmVar7->items = 0;
      pmVar7->maxitems = 0;
      ppvVar3 = pmVar7->firstblock;
      pmVar7->nowblock = ppvVar3;
      pmVar7->nextitem =
           (void *)((long)ppvVar3 +
                   (((long)pmVar7->alignbytes + 8U) -
                   (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar7->alignbytes));
      pmVar7->unallocateditems = pmVar7->itemsperblock;
      pmVar7->deaditemstack = (void *)0x0;
    }
  }
  return;
}

Assistant:

void tetgenmesh::repairencfacs(int chkencflag)
{
  face *bface;
  point encpt = NULL;
  int qflag = 0;
  REAL ccent[3];

  // Loop until the pool 'badsubfacs' is empty. Note that steinerleft == -1
  //   if an unlimited number of Steiner points is allowed.
  while ((badsubfacs->items > 0) && (steinerleft != 0)) {
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while ((bface != NULL) && (steinerleft != 0)) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        // A queued subface may have been deleted (split).
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          // A queued subface may have been processed. 
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
            if (checkfac4split(bface, encpt, qflag, ccent)) {
              splitsubface(bface, encpt, NULL, qflag, ccent, chkencflag);
            }
          }
        }
        bface->shver = -1; // Signal it as a deleted element.
        badsubfacs->dealloc((void *) bface); // Remove this entry from list.
      }
      bface = (face *) badsubfacs->traverse();
    }
  }

  if (badsubfacs->items > 0) {
    if (steinerleft == 0) {
      if (b->verbose) {
        printf("The desired number of Steiner points is reached.\n");
      }
    } else {
      terminatetetgen(this, 2);
    }
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while (bface  != NULL) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
          }
        }
      }
      bface = (face *) badsubfacs->traverse();
    }
    badsubfacs->restart();
  }
}